

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder capnp::DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Builder *builder)

{
  ArrayPtr<unsigned_char> AVar1;
  bool bVar2;
  Fault local_70;
  Fault f;
  Type *local_60;
  undefined1 local_58 [8];
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Builder *builder_local;
  char *pcStack_10;
  
  if (builder->type == TEXT) {
    join_0x00000010_0x00000000_ = Text::Builder::asBytes(&(builder->field_1).textValue);
    Data::Builder::Builder((Builder *)&builder_local,join_0x00000010_0x00000000_);
  }
  else {
    local_60 = (Type *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&builder->type);
    f.exception._4_4_ = 7;
    kj::_::DebugExpression<capnp::DynamicValue::Type&>::operator==
              ((DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_58,
               (DebugExpression<capnp::DynamicValue::Type&> *)&local_60,
               (Type *)((long)&f.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
    if (bVar2) {
      builder_local = (Builder *)(builder->field_1).anyPointerValue.builder.segment;
      pcStack_10 = (builder->field_1).textValue.content.ptr;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[21]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x755,FAILED,"builder.type == DATA","_kjCondition,\"Value type mismatch.\"",
                 (DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_58
                 ,(char (*) [21])"Value type mismatch.");
      builder_local = (Builder *)0x0;
      pcStack_10 = (char *)0x0;
      Data::Builder::Builder((Builder *)&builder_local);
      kj::_::Debug::Fault::~Fault(&local_70);
    }
  }
  AVar1.size_ = (size_t)pcStack_10;
  AVar1.ptr = (uchar *)builder_local;
  return (Builder)AVar1;
}

Assistant:

Data::Builder DynamicValue::Builder::AsImpl<Data>::apply(Builder& builder) {
  if (builder.type == TEXT) {
    // Coerce text to data.
    return builder.textValue.asBytes();
  }
  KJ_REQUIRE(builder.type == DATA, "Value type mismatch.") {
    return BuilderFor<Data>();
  }
  return builder.dataValue;
}